

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistanceShapeIndexTarget::UpdateMinDistance
          (S2MinDistanceShapeIndexTarget *this,S2Point *v0,S2Point *v1,S2MinDistance *min_dist)

{
  bool bVar1;
  undefined1 local_60 [8];
  EdgeTarget target;
  S2MinDistance *min_dist_local;
  S2Point *v1_local;
  S2Point *v0_local;
  S2MinDistanceShapeIndexTarget *this_local;
  
  target.super_S2MinDistanceEdgeTarget.b_.c_[2] = (VType)min_dist;
  S2ClosestEdgeQuery::EdgeTarget::EdgeTarget((EdgeTarget *)local_60,v0,v1);
  bVar1 = UpdateMinDistance(this,(S2MinDistanceTarget *)local_60,
                            (S2MinDistance *)target.super_S2MinDistanceEdgeTarget.b_.c_[2]);
  S2ClosestEdgeQuery::EdgeTarget::~EdgeTarget((EdgeTarget *)local_60);
  return bVar1;
}

Assistant:

bool S2MinDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MinDistance* min_dist) {
  S2ClosestEdgeQuery::EdgeTarget target(v0, v1);
  return UpdateMinDistance(&target, min_dist);
}